

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_functor::binary_op_max>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float *pfVar1;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [16];
  int in_R8D;
  undefined1 auVar2 [16];
  __m128 _outp;
  __m128 _p;
  __m128 _b_128;
  int i;
  float b;
  binary_op_max op;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d4;
  float local_d0;
  undefined1 local_c9 [5];
  int local_c4;
  float *local_c0;
  undefined1 (*local_b0) [16];
  undefined1 (*local_a8) [16];
  undefined8 local_98;
  undefined8 uStack_90;
  float *local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined1 *local_48;
  float *local_40;
  undefined1 (*local_38) [16];
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_d0 = *in_RSI;
  local_d4 = 0;
  if (in_R8D == 4) {
    local_118 = *(undefined8 *)in_RSI;
    uStack_110 = *(undefined8 *)(in_RSI + 2);
  }
  else {
    local_118 = CONCAT44(local_d0,local_d0);
    uStack_110 = CONCAT44(local_d0,local_d0);
    local_78 = local_d0;
    fStack_74 = local_d0;
    fStack_70 = local_d0;
    fStack_6c = local_d0;
    local_68 = local_d0;
  }
  local_e8 = local_118;
  uStack_e0 = uStack_110;
  local_c0 = in_RDX;
  local_b0 = in_RDI;
  for (; local_c4 = in_ECX, local_d4 + 3 < in_ECX; local_d4 = local_d4 + 4) {
    local_a8 = local_b0;
    local_f8 = *(undefined8 *)*local_b0;
    uStack_f0 = *(undefined8 *)(*local_b0 + 8);
    local_48 = local_c9;
    local_50 = &local_f8;
    local_58 = &local_e8;
    local_28 = local_118;
    uStack_20 = uStack_110;
    auVar2._8_8_ = uStack_110;
    auVar2._0_8_ = local_118;
    auVar2 = maxps(*local_b0,auVar2);
    local_80 = local_c0;
    local_108 = auVar2._0_8_;
    local_98 = local_108;
    uStack_100 = auVar2._8_8_;
    uStack_90 = uStack_100;
    *(undefined8 *)local_c0 = local_108;
    *(undefined8 *)(local_c0 + 2) = uStack_100;
    local_b0 = local_b0 + 1;
    local_c0 = local_c0 + 4;
    local_18 = local_f8;
    uStack_10 = uStack_f0;
  }
  for (; local_d4 < local_c4; local_d4 = local_d4 + 1) {
    local_30 = local_c9;
    local_38 = local_b0;
    local_40 = &local_d0;
    pfVar1 = std::max<float>((float *)local_b0,local_40);
    *local_c0 = *pfVar1;
    local_b0 = (undefined1 (*) [16])(*local_b0 + 4);
    local_c0 = local_c0 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}